

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall
helics::tcp::TcpComms::txReceive
          (TcpComms *this,char *data,size_t bytes_received,string *errorMessage)

{
  bool bVar1;
  ActionMessage *in_RDI;
  ActionMessage m;
  size_t in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  ActionMessage *in_stack_ffffffffffffff30;
  ActionMessage *in_stack_ffffffffffffff40;
  route_id *in_stack_ffffffffffffff48;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_ffffffffffffff50;
  CommsInterface *in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff78;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d33c1);
  if (bVar1) {
    ActionMessage::ActionMessage
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    bVar1 = isProtocolCommand(in_RDI);
    if (bVar1) {
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
      ::emplace<helics::route_id_const&,helics::ActionMessage&>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    ActionMessage::~ActionMessage(in_RDI);
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    CommsInterface::logError(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void TcpComms::txReceive(const char* data, size_t bytes_received, const std::string& errorMessage)
{
    if (errorMessage.empty()) {
        ActionMessage m(reinterpret_cast<const std::byte*>(data), bytes_received);
        if (isProtocolCommand(m)) {
            txQueue.emplace(control_route, m);
        }
    } else {
        logError(errorMessage);
    }
}